

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::PrintStatementSourceLineFromStartOffset(FunctionBody *this,uint cchStartOffset)

{
  code *pcVar1;
  Utf8SourceInfo *pch;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  ISourceHolder *pIVar6;
  ISourceHolder *pIVar7;
  size_t sVar8;
  Memory *this_00;
  char16_t *pcVar9;
  ulong local_a0;
  size_t i;
  size_t utf16BufSz;
  TrackAllocData local_80;
  char16_t *local_58;
  char16 *utf16Buf;
  size_t utf8SrcEndIdx;
  size_t utf8SrcStartIdx;
  Utf8SourceInfo *pUStack_38;
  WORD color;
  LPCUTF8 sourceInfoSrc;
  Utf8SourceInfo *sourceInfo;
  LPCUTF8 source;
  ULONG local_18;
  LONG col;
  ULONG line;
  uint cchStartOffset_local;
  FunctionBody *this_local;
  
  col = cchStartOffset;
  _line = this;
  sourceInfo = (Utf8SourceInfo *)
               ParseableFunctionInfo::GetStartOfDocument
                         (&this->super_ParseableFunctionInfo,
                          L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  sourceInfoSrc = (LPCUTF8)FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
  if ((Utf8SourceInfo *)sourceInfoSrc == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x120a,"(sourceInfo != nullptr)","sourceInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pUStack_38 = (Utf8SourceInfo *)
               Utf8SourceInfo::GetSource
                         ((Utf8SourceInfo *)sourceInfoSrc,
                          L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  if (pUStack_38 == (Utf8SourceInfo *)0x0) {
    bVar2 = Utf8SourceInfo::GetIsLibraryCode((Utf8SourceInfo *)sourceInfoSrc);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x120e,"(sourceInfo->GetIsLibraryCode())",
                                  "sourceInfo->GetIsLibraryCode()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    if (sourceInfo != pUStack_38) {
      Output::Print(L"\nDETECTED MISMATCH:\n");
      Output::Print(L"GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n",sourceInfoSrc,0x10,
                    sourceInfoSrc);
      Output::Print(L"GetStartOfDocument():             0x%08X: %.*s ...\n",sourceInfo,0x10,
                    sourceInfo);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1217,"(false)","Non-matching start of document");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    GetLineCharOffsetFromStartChar(this,col,&local_18,(LONG *)((long)&source + 4),false);
    pIVar6 = Utf8SourceInfo::GetSourceHolder((Utf8SourceInfo *)sourceInfoSrc);
    pIVar7 = ISourceHolder::GetEmptySourceHolder();
    if (pIVar6 != pIVar7) {
      utf8SrcStartIdx._6_2_ = 0;
      if ((DAT_01ea40f9 & 1) != 0) {
        utf8SrcStartIdx._6_2_ = Output::SetConsoleForeground(0xc);
      }
      Output::Print(L"\n\n  Line %3d: ",(ulong)(local_18 + 1));
      pch = sourceInfo;
      sVar8 = Utf8SourceInfo::GetCbLength((Utf8SourceInfo *)sourceInfoSrc,(char16 *)0x0);
      utf8SrcEndIdx =
           utf8::CharacterIndexToByteIndex
                     ((LPCUTF8)pch,sVar8,col,
                      (ulong)(this->super_ParseableFunctionInfo).m_cbStartOffset,
                      (this->super_ParseableFunctionInfo).m_cchStartOffset,doDefault);
      uVar3 = ParseableFunctionInfo::StartOffset(&this->super_ParseableFunctionInfo);
      uVar4 = ParseableFunctionInfo::LengthInBytes(&this->super_ParseableFunctionInfo);
      utf16Buf = (char16 *)(ulong)(uVar3 + uVar4);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_80,(type_info *)&char16_t::typeinfo,0,(long)utf16Buf + (2 - utf8SrcEndIdx),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                 ,0x1227);
      this_00 = (Memory *)
                Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_80);
      local_58 = Memory::AllocateArray<Memory::HeapAllocator,char16_t,false>
                           (this_00,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                            (long)utf16Buf + (2 - utf8SrcEndIdx));
      sVar8 = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                        (local_58,(LPCUTF8)((long)&(sourceInfo->super_FinalizableObject).
                                                   super_IRecyclerVisitedObject.
                                                   _vptr_IRecyclerVisitedObject + utf8SrcEndIdx),
                         (LPCUTF8)((long)&(sourceInfo->super_FinalizableObject).
                                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                                  + (long)utf16Buf),doDefault,(bool *)0x0);
      if ((long)utf16Buf - utf8SrcEndIdx < sVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1229,"(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx)",
                                    "utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_a0 = 0;
      while( true ) {
        bVar2 = false;
        if ((local_a0 < sVar8) && (bVar2 = false, local_58[local_a0] != L'\n')) {
          bVar2 = local_58[local_a0] != L'\r';
        }
        if (!bVar2) break;
        Output::Print(L"%lc",(ulong)(ushort)local_58[local_a0]);
        local_a0 = local_a0 + 1;
      }
      Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                (&Memory::HeapAllocator::Instance,(long)utf16Buf + (2 - utf8SrcEndIdx),local_58);
      Output::Print(L"\n");
      pcVar9 = L"";
      if (source._4_4_ + 1 < 10000) {
        pcVar9 = L" ";
      }
      Output::Print(L"  Col %4d:%s^\n",(ulong)(source._4_4_ + 1),pcVar9);
      if (utf8SrcStartIdx._6_2_ != 0) {
        Output::SetConsoleForeground(utf8SrcStartIdx._6_2_);
      }
    }
  }
  return;
}

Assistant:

void FunctionBody::PrintStatementSourceLineFromStartOffset(uint cchStartOffset)
    {
        ULONG line;
        LONG col;

        LPCUTF8 source = GetStartOfDocument(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        Utf8SourceInfo* sourceInfo = this->GetUtf8SourceInfo();
        Assert(sourceInfo != nullptr);
        LPCUTF8 sourceInfoSrc = sourceInfo->GetSource(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        if(!sourceInfoSrc)
        {
            Assert(sourceInfo->GetIsLibraryCode());
            return;
        }
        if( source != sourceInfoSrc )
        {
            Output::Print(_u("\nDETECTED MISMATCH:\n"));
            Output::Print(_u("GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n"), sourceInfo, 16, sourceInfo);
            Output::Print(_u("GetStartOfDocument():             0x%08X: %.*s ...\n"), source, 16, source);

            AssertMsg(false, "Non-matching start of document");
        }

        GetLineCharOffsetFromStartChar(cchStartOffset, &line, &col, false /*canAllocateLineCache*/);

        if (sourceInfo->GetSourceHolder() != ISourceHolder::GetEmptySourceHolder())
        {
            WORD color = 0;
            if (Js::Configuration::Global.flags.DumpLineNoInColor)
            {
                color = Output::SetConsoleForeground(12);
            }
            Output::Print(_u("\n\n  Line %3d: "), line + 1);
            // Need to match up cchStartOffset to appropriate cbStartOffset given function's cbStartOffset and cchStartOffset
            size_t utf8SrcStartIdx = utf8::CharacterIndexToByteIndex(source, sourceInfo->GetCbLength(), cchStartOffset, this->m_cbStartOffset, this->m_cchStartOffset);
            size_t utf8SrcEndIdx = StartOffset() + LengthInBytes();
            char16* utf16Buf = HeapNewArray(char16, utf8SrcEndIdx - utf8SrcStartIdx + 2); 
            size_t utf16BufSz = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(utf16Buf, source + utf8SrcStartIdx, source + utf8SrcEndIdx, utf8::DecodeOptions::doDefault);
            Assert(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx);
            for (size_t i = 0; i < utf16BufSz && utf16Buf[i] != _u('\n') && utf16Buf[i] != _u('\r'); i++)
            {
                Output::Print(_u("%lc"), utf16Buf[i]);
            }
            HeapDeleteArray(utf8SrcEndIdx - utf8SrcStartIdx + 2, utf16Buf);
            Output::Print(_u("\n"));
            Output::Print(_u("  Col %4d:%s^\n"), col + 1, ((col+1)<10000) ? _u(" ") : _u(""));

            if (color != 0)
            {
                Output::SetConsoleForeground(color);
            }
        }
    }